

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int ReadInt64(unqlite_file *pFd,sxu64 *pOut,sxi64 iOfft)

{
  uchar local_30 [4];
  int rc;
  uchar zBuf [8];
  sxi64 iOfft_local;
  sxu64 *pOut_local;
  unqlite_file *pFd_local;
  
  zBuf = (uchar  [8])iOfft;
  pFd_local._4_4_ = unqliteOsRead(pFd,local_30,8,iOfft);
  if (pFd_local._4_4_ == 0) {
    SyBigEndianUnpack64(local_30,pOut);
    pFd_local._4_4_ = 0;
  }
  return pFd_local._4_4_;
}

Assistant:

static int ReadInt64(unqlite_file *pFd,sxu64 *pOut,sxi64 iOfft)
{
	unsigned char zBuf[8];
	int rc;
	rc = unqliteOsRead(pFd,zBuf,sizeof(zBuf),iOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	SyBigEndianUnpack64(zBuf,pOut);
	return UNQLITE_OK;
}